

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constpool.cpp
# Opt level: O2

void asmjit::v1_14::ConstPool_addGap(ConstPool *self,size_t offset,size_t size)

{
  Gap *pGVar1;
  size_t sVar2;
  size_t sStack_40;
  
  do {
    if (size == 0) {
      return;
    }
    if (size < 0x20) {
      if (0xf < size) goto LAB_00114d48;
      if (7 < size) goto LAB_00114d61;
      if (3 < size) goto LAB_00114d6e;
      sStack_40 = 1;
      sVar2 = sStack_40;
      sStack_40 = 2;
      if (size != 1 && (offset & 1) == 0) goto LAB_00114d90;
LAB_00114d89:
      sStack_40 = 1;
      sVar2 = 0;
    }
    else {
      sVar2 = 5;
      sStack_40 = 0x20;
      if ((offset & 0x1f) != 0) {
LAB_00114d48:
        sStack_40 = 0x10;
        sVar2 = 4;
        if ((offset & 0xf) != 0) {
LAB_00114d61:
          sVar2 = 3;
          sStack_40 = 8;
          if ((offset & 7) != 0) {
LAB_00114d6e:
            sVar2 = 2;
            sStack_40 = 4;
            if ((offset & 3) != 0) {
              sStack_40 = 2;
              sVar2 = 1;
              if ((offset & 1) != 0) goto LAB_00114d89;
            }
          }
        }
      }
    }
LAB_00114d90:
    pGVar1 = self->_gapPool;
    if (pGVar1 == (Gap *)0x0) {
      pGVar1 = (Gap *)Zone::alloc(self->_zone,0x18,8);
      if (pGVar1 == (Gap *)0x0) {
        return;
      }
    }
    else {
      self->_gapPool = pGVar1->_next;
    }
    pGVar1->_next = self->_gaps[sVar2];
    self->_gaps[sVar2] = pGVar1;
    pGVar1->_offset = offset;
    pGVar1->_size = sStack_40;
    offset = offset + sStack_40;
    size = size - sStack_40;
  } while( true );
}

Assistant:

static void ConstPool_addGap(ConstPool* self, size_t offset, size_t size) noexcept {
  ASMJIT_ASSERT(size > 0);

  while (size > 0) {
    size_t gapIndex;
    size_t gapSize;

    if (size >= 32 && Support::isAligned<size_t>(offset, 32)) {
      gapIndex = ConstPool::kIndex32;
      gapSize = 32;
    }
    else if (size >= 16 && Support::isAligned<size_t>(offset, 16)) {
      gapIndex = ConstPool::kIndex16;
      gapSize = 16;
    }
    else if (size >= 8 && Support::isAligned<size_t>(offset, 8)) {
      gapIndex = ConstPool::kIndex8;
      gapSize = 8;
    }
    else if (size >= 4 && Support::isAligned<size_t>(offset, 4)) {
      gapIndex = ConstPool::kIndex4;
      gapSize = 4;
    }
    else if (size >= 2 && Support::isAligned<size_t>(offset, 2)) {
      gapIndex = ConstPool::kIndex2;
      gapSize = 2;
    }
    else {
      gapIndex = ConstPool::kIndex1;
      gapSize = 1;
    }

    // We don't have to check for errors here, if this failed nothing really happened (just the gap won't be
    // visible) and it will fail again at place where the same check would generate `kErrorOutOfMemory` error.
    ConstPool::Gap* gap = ConstPool_allocGap(self);
    if (!gap)
      return;

    gap->_next = self->_gaps[gapIndex];
    self->_gaps[gapIndex] = gap;

    gap->_offset = offset;
    gap->_size = gapSize;

    offset += gapSize;
    size -= gapSize;
  }
}